

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  t_domain tVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _Alloc_hider __s;
  byte *pbVar7;
  size_t sVar8;
  undefined8 uVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ostream *poVar12;
  long *plVar13;
  undefined7 in_register_00000009;
  size_type *psVar14;
  byte *pbVar15;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte bVar19;
  string varresult;
  string result;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string svalue;
  ostringstream ostr;
  string local_300;
  string *local_2e0;
  string local_2d8;
  cmMakefile *local_2b8;
  MessageType local_2b0;
  allocator local_2ac;
  allocator local_2ab;
  allocator local_2aa;
  allocator local_2a9;
  string local_2a8;
  undefined1 *local_288;
  size_t local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  t_lookup *local_268;
  iterator iStack_260;
  t_lookup *local_258;
  undefined4 local_244;
  ulong local_240;
  string local_238;
  long local_218;
  undefined4 local_210;
  undefined4 local_20c;
  string *local_208;
  RegularExpression *local_200;
  cmStateSnapshot *local_1f8;
  cmState *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_210 = CONCAT31(in_register_00000089,atOnly);
  local_20c = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_244 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar15 = (byte *)(source->_M_dataplus)._M_p;
  local_288 = &local_278;
  local_280 = 0;
  local_278 = 0;
  local_2e0 = errorstr;
  local_208 = source;
  std::__cxx11::string::reserve((ulong)&local_288);
  local_218 = line;
  local_268 = (t_lookup *)0x0;
  iStack_260._M_current = (t_lookup *)0x0;
  local_258 = (t_lookup *)0x0;
  local_1f0 = this->GlobalGenerator->CMakeInstance->State;
  bVar19 = *pbVar15;
  local_200 = &this->cmNamedCurly;
  local_1f8 = &this->StateSnapshot;
  local_2b0 = LOG;
  local_240 = 0;
  pbVar18 = pbVar15;
  local_2b8 = this;
  do {
    if (bVar19 < 0x40) {
      if (bVar19 == 10) {
        local_218 = local_218 + 1;
      }
      else {
        if (bVar19 != 0x24) {
          if (bVar19 != 0) goto LAB_002e53de;
          if ((local_240 & 1) != 0) goto LAB_002e5d5d;
          break;
        }
        if ((char)local_210 != '\0') goto LAB_002e51f8;
        local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
        local_238._M_string_length = 0;
        pbVar17 = pbVar15 + 1;
        bVar19 = pbVar15[1];
        if (bVar19 == 0) {
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          pbVar18 = pbVar17;
        }
        else if (bVar19 != 0x3c) {
          if (bVar19 == 0x7b) {
            pbVar17 = pbVar15 + 2;
          }
          else {
            iVar6 = strncmp((char *)pbVar17,"ENV{",4);
            if (iVar6 == 0) {
              pbVar17 = pbVar15 + 5;
              local_238._M_dataplus._M_p._0_4_ = 1;
            }
            else {
              iVar6 = strncmp((char *)pbVar17,"CACHE{",6);
              if (iVar6 != 0) {
                bVar4 = cmsys::RegularExpression::find(local_200,(char *)pbVar17);
                if (bVar4) {
                  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2d8,pbVar17,
                             pbVar17 + ((long)(local_2b8->cmNamedCurly).endp[0] -
                                       (long)(local_2b8->cmNamedCurly).searchstring));
                  plVar13 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_2d8,0,(char *)0x0,0x5b6330);
                  psVar14 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar14) {
                    local_300.field_2._M_allocated_capacity = *psVar14;
                    local_300.field_2._8_8_ = plVar13[3];
                    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
                  }
                  else {
                    local_300.field_2._M_allocated_capacity = *psVar14;
                    local_300._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_300._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar14;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_300);
                  psVar14 = (size_type *)(plVar13 + 2);
                  if ((size_type *)*plVar13 == psVar14) {
                    local_1a8._16_8_ = *psVar14;
                    local_1a8._24_8_ = plVar13[3];
                    local_1a8._0_8_ = local_1a8 + 0x10;
                  }
                  else {
                    local_1a8._16_8_ = *psVar14;
                    local_1a8._0_8_ = (size_type *)*plVar13;
                  }
                  local_1a8._8_8_ = plVar13[1];
                  *plVar13 = (long)psVar14;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_2e0,(string *)local_1a8);
                  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_300._M_dataplus._M_p != &local_300.field_2) {
                    operator_delete(local_300._M_dataplus._M_p,
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                  paVar11 = &local_2d8.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._M_dataplus._M_p != paVar11) {
                    operator_delete(local_2d8._M_dataplus._M_p,
                                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                             local_2d8.field_2._M_local_buf[0]) + 1);
                    paVar11 = extraout_RAX;
                  }
                  local_2b0 = FATAL_ERROR;
                  local_240 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
                }
                goto LAB_002e5426;
              }
              pbVar17 = pbVar15 + 7;
              local_238._M_dataplus._M_p._0_4_ = 2;
            }
          }
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          local_238._M_string_length = local_280;
          pbVar15 = pbVar17 + -1;
          pbVar18 = pbVar17;
          if (iStack_260._M_current == local_258) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_268,iStack_260,
                       (t_lookup *)&local_238);
          }
          else {
            *(pointer *)iStack_260._M_current = local_238._M_dataplus._M_p;
            (iStack_260._M_current)->loc = local_280;
            iStack_260._M_current = iStack_260._M_current + 1;
          }
        }
      }
    }
    else if (bVar19 == 0x40) {
      if (replaceAt) {
        pbVar17 = pbVar15 + 1;
        pbVar7 = (byte *)strchr((char *)pbVar17,0x40);
        if ((pbVar7 != pbVar17 && pbVar7 != (byte *)0x0) &&
           (sVar8 = strspn((char *)pbVar17,
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar7 == pbVar17 + sVar8)) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pbVar17,pbVar17 + ~(ulong)pbVar15 + (long)pbVar7);
          pcVar10 = GetDefinition(local_2b8,(string *)local_1a8);
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "";
          }
          std::__cxx11::string::string((string *)&local_300,pcVar10,(allocator *)&local_2d8);
          if ((char)local_244 != '\0') {
            cmSystemTools::EscapeQuotes(&local_2d8,&local_300);
            std::__cxx11::string::operator=((string *)&local_300,(string *)&local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,
                              CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                       local_2d8.field_2._M_local_buf[0]) + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_300._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar15 = pbVar7;
          pbVar18 = pbVar7 + 1;
          goto LAB_002e5426;
        }
      }
LAB_002e53de:
      if (((local_268 != iStack_260._M_current) && (iVar6 = isalnum((int)(char)bVar19), iVar6 == 0))
         && ((uVar16 = bVar19 - 0x2b, 0x34 < uVar16 ||
             ((0x1000000000001dU >> ((ulong)uVar16 & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)local_2e0);
        std::__cxx11::string::push_back((char)local_2e0);
        std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
        std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&local_288);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x5b6405);
        psVar14 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_300.field_2._M_allocated_capacity = *psVar14;
          local_300.field_2._8_8_ = plVar13[3];
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar14;
          local_300._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_300._M_string_length = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_300);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar14 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar14) {
          local_1a8._16_8_ = *psVar14;
          local_1a8._24_8_ = plVar13[3];
        }
        else {
          local_1a8._16_8_ = *psVar14;
          local_1a8._0_8_ = (size_type *)*plVar13;
        }
        local_1a8._8_8_ = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_2e0,local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,
                          CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                   local_2d8.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_002e5d5d;
      }
    }
    else if (bVar19 == 0x5c) {
LAB_002e51f8:
      if ((char)local_20c != '\0') goto LAB_002e5426;
      bVar19 = pbVar15[1];
      if (bVar19 < 0x72) {
        if (bVar19 == 0x3b) {
          if (local_268 == iStack_260._M_current) goto LAB_002e5791;
        }
        else if (bVar19 == 0x6e) {
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          std::__cxx11::string::append((char *)&local_288);
          goto LAB_002e5661;
        }
LAB_002e55fd:
        iVar6 = isalnum((int)(char)bVar19);
        if ((bVar19 == 0) || (iVar6 != 0)) {
          uVar9 = std::__cxx11::string::append((char *)local_2e0);
          if (bVar19 != 0) {
            uVar9 = std::__cxx11::string::push_back((char)local_2e0);
          }
          local_240 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          std::__cxx11::string::append((char *)local_2e0);
        }
        else {
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          pbVar18 = pbVar15 + 1;
        }
      }
      else {
        if (bVar19 == 0x72) {
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          std::__cxx11::string::append((char *)&local_288);
        }
        else {
          if (bVar19 != 0x74) goto LAB_002e55fd;
          std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
          std::__cxx11::string::append((char *)&local_288);
        }
LAB_002e5661:
        pbVar18 = pbVar15 + 2;
      }
LAB_002e5791:
      if (*pbVar18 != 0) {
        pbVar15 = pbVar15 + 1;
      }
    }
    else {
      if (bVar19 != 0x7d) goto LAB_002e53de;
      if (local_268 == iStack_260._M_current) goto LAB_002e5426;
      tVar1 = iStack_260._M_current[-1].domain;
      uVar2 = iStack_260._M_current[-1].loc;
      iStack_260._M_current = iStack_260._M_current + -1;
      std::__cxx11::string::append((char *)&local_288,(ulong)pbVar18);
      std::__cxx11::string::substr((ulong)&local_300,(ulong)&local_288);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_2d8._M_string_length = 0;
      local_2d8.field_2._M_local_buf[0] = '\0';
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar6 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (tVar1 == NORMAL) {
        if (((filename == (char *)0x0) ||
            (local_300._M_string_length !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_300._M_string_length != 0 &&
            (iVar6 = bcmp(local_300._M_dataplus._M_p,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_300._M_string_length),
            iVar6 != 0)))) {
          __s._M_p = GetDefinition(local_2b8,&local_300);
          goto LAB_002e5540;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<long>((long)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
LAB_002e5858:
        if (((!removeEmpty) &&
            (local_2b8->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) &&
           (bVar4 = cmStateSnapshot::IsInitialized(local_1f8,&local_300), !bVar4)) {
          if (local_2b8->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)local_1a8,filename,&local_2a9);
            pcVar10 = cmake::GetHomeDirectory(local_2b8->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)&local_2a8,pcVar10,&local_2aa);
            bVar4 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,&local_2a8);
            bVar5 = true;
            if (!bVar4) {
              std::__cxx11::string::string((string *)&local_1e8,filename,&local_2ab);
              pcVar10 = cmake::GetHomeOutputDirectory(local_2b8->GlobalGenerator->CMakeInstance);
              std::__cxx11::string::string((string *)&local_1c8,pcVar10,&local_2ac);
              bVar5 = cmsys::SystemTools::IsSubDirectory(&local_1e8,&local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (bVar5 == false) goto LAB_002e5aac;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"uninitialized variable \'",0x18);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_300._M_dataplus._M_p,
                               local_300._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
          std::__cxx11::stringbuf::str();
          IssueMessage(local_2b8,AUTHOR_WARNING,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        if (tVar1 == ENVIRONMENT) {
          bVar4 = cmsys::SystemTools::GetEnv(&local_300,&local_238);
          __s._M_p = local_238._M_dataplus._M_p;
          if (bVar4) goto LAB_002e5540;
          goto LAB_002e5858;
        }
        if (tVar1 != CACHE) goto LAB_002e5858;
        __s._M_p = cmState::GetCacheEntryValue(local_1f0,&local_300);
LAB_002e5540:
        sVar3 = local_2d8._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_002e5858;
        if ((char)local_244 == '\0') {
          strlen(__s._M_p);
          std::__cxx11::string::_M_replace((ulong)&local_2d8,0,(char *)sVar3,(ulong)__s._M_p);
        }
        else {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          sVar8 = strlen(__s._M_p);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,__s._M_p,__s._M_p + sVar8);
          cmSystemTools::EscapeQuotes((string *)local_1a8,&local_2a8);
          std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
      }
LAB_002e5aac:
      std::__cxx11::string::replace
                ((ulong)&local_288,uVar2,(char *)(local_280 - uVar2),
                 (ulong)local_2d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                 local_2d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      pbVar18 = pbVar15 + 1;
    }
LAB_002e5426:
    if ((local_240 & 1) != 0) goto LAB_002e5d5d;
    bVar19 = pbVar15[1];
    pbVar15 = pbVar15 + 1;
  } while (bVar19 != 0);
  if (local_268 == iStack_260._M_current) {
    std::__cxx11::string::append((char *)&local_288);
    std::__cxx11::string::_M_assign((string *)local_208);
  }
  else {
    std::__cxx11::string::append((char *)local_2e0);
LAB_002e5d5d:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar8 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar12 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_208->_M_dataplus)._M_p,
                         local_208->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_2e0->_M_dataplus)._M_p,local_2e0->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2b0 = FATAL_ERROR;
  }
  if (local_268 != (t_lookup *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  return local_2b0;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = CM_NULLPTR;
          std::string varresult;
          std::string svalue;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!removeEmpty) {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if (this->GetCMakeInstance()->GetWarnUninitialized() &&
                !this->VariableInitialized(lookup)) {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(
                    filename, this->GetHomeOutputDirectory())) {
                std::ostringstream msg;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
              }
            }
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = CM_NULLPTR;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 + strspn(in + 1, "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                                        "abcdefghijklmnopqrstuvwxyz"
                                        "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}